

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O0

void data_report(ReportWriter *writer,Trace *trace,AnnotationResolver *annotations,
                bool include_hwregs,bool include_7e7f)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *text;
  ulong uVar4;
  size_type_conflict sVar5;
  const_reference pvVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  undefined8 uVar11;
  pair<std::_Rb_tree_const_iterator<const_snestistics::Annotation_*>,_bool> pVar12;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar13;
  bool local_13aa;
  bool local_137a;
  bool local_1362;
  bool local_134a;
  bool local_1332;
  Pointer local_1324;
  undefined1 local_12f0 [7];
  bool first_line;
  AccessIterator writers;
  AccessIterator readers;
  iterator iStack_12b8;
  bool update_globals;
  _Self local_12b0;
  _Base_ptr local_12a8;
  undefined1 local_12a0;
  _Self local_1298;
  _Self local_1290;
  _Base_ptr local_1288;
  undefined1 local_1280;
  _Self local_1278;
  _Self local_1270;
  _Base_ptr local_1268;
  undefined1 local_1260;
  _Self local_1258;
  _Self local_1250;
  _Base_ptr local_1248;
  undefined1 local_1240;
  Annotation *local_1238;
  Annotation *our_function;
  byte local_1225;
  Pointer pc;
  uint uStack_1220;
  bool is_write;
  MemoryAccess rb_1;
  uint32_t j_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> new_unknown_writers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  new_writers;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> new_unknown_readers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  new_readers;
  bool need_flush;
  MemoryAccess rb;
  uint32_t j;
  Annotation *accessed_function;
  Annotation *data;
  uint32_t bank_less_adress;
  uint uStack_112c;
  uint8_t bank;
  Pointer adress;
  MemoryAccess ra;
  uint32_t p;
  Annotation *global_data;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> global_unknown_writers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  global_writers;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> global_unknown_readers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  global_readers;
  uint local_1050;
  Pointer last_global;
  Pointer first_global;
  undefined1 local_1040 [8];
  Profile profile;
  StringBuilder sb;
  bool include_7e7f_local;
  bool include_hwregs_local;
  AnnotationResolver *annotations_local;
  Trace *trace_local;
  ReportWriter *writer_local;
  
  snestistics::StringBuilder::StringBuilder((StringBuilder *)&profile._hide_if_fast);
  snestistics::Profile::Profile((Profile *)local_1040,"Data report",true);
  ReportWriter::writeSeperator(writer,"Data analysis");
  snestistics::StringBuilder::clear((StringBuilder *)&profile._hide_if_fast);
  snestistics::StringBuilder::format((StringBuilder *)&profile._hide_if_fast,"DATA RANGE");
  snestistics::StringBuilder::column((StringBuilder *)&profile._hide_if_fast,0x14,4);
  snestistics::StringBuilder::format((StringBuilder *)&profile._hide_if_fast,"READERS");
  snestistics::StringBuilder::column((StringBuilder *)&profile._hide_if_fast,0x3c,4);
  snestistics::StringBuilder::format((StringBuilder *)&profile._hide_if_fast,"WRITERS");
  snestistics::StringBuilder::column((StringBuilder *)&profile._hide_if_fast,0x5a,4);
  snestistics::StringBuilder::format((StringBuilder *)&profile._hide_if_fast,"ANNOTATIONS");
  text = snestistics::StringBuilder::c_str((StringBuilder *)&profile._hide_if_fast);
  ReportWriter::writeSeperator(writer,text);
  local_1050 = 0xffffffff;
  global_readers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0xffffffff;
  std::
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  ::set((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
         *)&global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  ::set((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
         *)&global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &global_data);
  stack0xffffffffffffeee0 = (Annotation *)0x0;
  ra.adress = 0;
LAB_0017021b:
  do {
    uVar4 = (ulong)ra.adress;
    sVar5 = std::
            vector<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
            ::size(&trace->memory_accesses);
    if (sVar5 <= uVar4) {
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &global_data);
      std::
      set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
      ::~set((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
              *)&global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
      ::~set((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
              *)&global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count);
      snestistics::Profile::~Profile((Profile *)local_1040);
      return;
    }
    pvVar6 = std::
             vector<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
             ::operator[](&trace->memory_accesses,(ulong)ra.adress);
    _uStack_112c = *pvVar6;
    bank_less_adress = uStack_112c;
    data._7_1_ = uStack_112c._2_1_;
    data._0_4_ = uStack_112c & 0xffff;
    if ((data._7_1_ != '~') && (data._7_1_ != '\x7f')) {
      if (((include_hwregs) || ((uint)data < 0x2000)) || (0x43ff < (uint)data)) {
LAB_00170312:
        accessed_function = (Annotation *)0x0;
        stack0xffffffffffffeeb8 = 0;
        snestistics::AnnotationResolver::resolve_annotation
                  (annotations,uStack_112c,(Annotation **)&rb.pc,&accessed_function);
        if (stack0xffffffffffffeeb8 == 0) {
          bVar2 = false;
          std::
          set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
          ::set((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                 *)&new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &new_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
          ::set((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                 *)&new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &rb_1.pc);
          for (rb_1.adress = ra.adress; uVar4 = (ulong)rb_1.adress,
              sVar5 = std::
                      vector<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                      ::size(&trace->memory_accesses), uVar4 < sVar5; rb_1.adress = rb_1.adress + 1)
          {
            pvVar6 = std::
                     vector<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                     ::operator[](&trace->memory_accesses,(ulong)rb_1.adress);
            _pc = *pvVar6;
            if (bank_less_adress != pc) break;
            local_1225 = ((ulong)_pc & 0x8000000000000000) != 0;
            if ((bool)local_1225) {
              local_1324 = uStack_1220 & 0x7fffffff;
            }
            else {
              local_1324 = uStack_1220;
            }
            our_function._4_4_ = local_1324;
            local_1238 = (Annotation *)0x0;
            snestistics::AnnotationResolver::resolve_annotation
                      (annotations,local_1324,&local_1238,(Annotation **)0x0);
            if (local_1238 == (Annotation *)0x0) {
              if ((local_1225 & 1) == 0) {
                pVar13 = std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&new_writers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (value_type_conflict *)((long)&our_function + 4));
                local_12a8 = (_Base_ptr)pVar13.first._M_node;
                local_12a0 = pVar13.second;
                local_137a = false;
                if (!bVar2) {
                  local_12b0._M_node =
                       (_Base_ptr)
                       std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       find((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)((long)&our_function + 4));
                  iStack_12b8 = std::
                                set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                ::end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                       *)&global_writers._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
                  local_137a = std::operator==(&local_12b0,&stack0xffffffffffffed48);
                }
                if (local_137a != false) {
                  bVar2 = true;
                }
              }
              else {
                pVar13 = std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&rb_1.pc,(value_type_conflict *)((long)&our_function + 4));
                local_1288 = (_Base_ptr)pVar13.first._M_node;
                local_1280 = pVar13.second;
                local_1362 = false;
                if (!bVar2) {
                  local_1290._M_node =
                       (_Base_ptr)
                       std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       find((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&rb_1.pc,(key_type *)((long)&our_function + 4));
                  local_1298._M_node =
                       (_Base_ptr)
                       std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&rb_1.pc);
                  local_1362 = std::operator==(&local_1290,&local_1298);
                }
                if (local_1362 != false) {
                  bVar2 = true;
                }
              }
            }
            else if ((local_1225 & 1) == 0) {
              pVar12 = std::
                       set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                       ::insert((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                                 *)&new_unknown_readers._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,&local_1238);
              local_1268 = (_Base_ptr)pVar12.first._M_node;
              local_1260 = pVar12.second;
              local_134a = false;
              if (!bVar2) {
                local_1270._M_node =
                     (_Base_ptr)
                     std::
                     set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                     ::find((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                             *)&global_unknown_readers._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,&local_1238);
                local_1278._M_node =
                     (_Base_ptr)
                     std::
                     set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                     ::end((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                            *)&global_unknown_readers._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
                local_134a = std::operator==(&local_1270,&local_1278);
              }
              if (local_134a != false) {
                bVar2 = true;
              }
            }
            else {
              pVar12 = std::
                       set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                       ::insert((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                                 *)&new_unknown_writers._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,&local_1238);
              local_1248 = (_Base_ptr)pVar12.first._M_node;
              local_1240 = pVar12.second;
              local_1332 = false;
              if (!bVar2) {
                local_1250._M_node =
                     (_Base_ptr)
                     std::
                     set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                     ::find((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                             *)&global_unknown_writers._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,&local_1238);
                local_1258._M_node =
                     (_Base_ptr)
                     std::
                     set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                     ::end((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                            *)&global_unknown_writers._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
                local_1332 = std::operator==(&local_1250,&local_1258);
              }
              if (local_1332 != false) {
                bVar2 = true;
              }
            }
            ra.adress = ra.adress + 1;
          }
          if (accessed_function != stack0xffffffffffffeee0) {
            bVar2 = true;
          }
          if (local_1050 != 0xffffffff) {
            sVar7 = std::
                    set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                    ::size((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                            *)&new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count)
            ;
            sVar8 = std::
                    set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                    ::size((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                            *)&global_unknown_readers._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
            if (sVar7 == sVar8) {
              sVar9 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
              sVar10 = std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&new_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
              if (sVar9 != sVar10) goto LAB_00170913;
            }
            else {
LAB_00170913:
              bVar2 = true;
            }
            sVar7 = std::
                    set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                    ::size((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                            *)&new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count)
            ;
            sVar8 = std::
                    set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                    ::size((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                            *)&global_unknown_writers._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
            if (sVar7 == sVar8) {
              sVar9 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&global_data);
              sVar10 = std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&rb_1.pc);
              if (sVar9 == sVar10) goto LAB_0017097f;
            }
            bVar2 = true;
          }
LAB_0017097f:
          bVar1 = false;
          if ((bVar2) || (local_1050 == 0xffffffff)) {
            bVar1 = true;
          }
          data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
          AnnotationResolver_const&,bool,bool)::AccessIterator::AccessIterator(std::set<snestistics
          ::Annotation_const*,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::
          Annotation_const*>>const&,std::set<unsigned_int,std::less<unsigned_int>,std::
          allocator<unsigned_int>_>_const__
                    (&writers._current,
                     (set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                      *)&global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
          data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
          AnnotationResolver_const&,bool,bool)::AccessIterator::AccessIterator(std::set<snestistics
          ::Annotation_const*,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::
          Annotation_const*>>const&,std::set<unsigned_int,std::less<unsigned_int>,std::
          allocator<unsigned_int>_>_const__
                    (local_12f0,
                     (set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                      *)&global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &global_data);
          if (bVar2) {
            bVar2 = true;
            while( true ) {
              bVar3 = data_report::AccessIterator::has((AccessIterator *)&writers._current);
              local_13aa = true;
              if (!bVar3) {
                local_13aa = data_report::AccessIterator::has((AccessIterator *)local_12f0);
              }
              if (local_13aa == false) break;
              snestistics::StringBuilder::clear((StringBuilder *)&profile._hide_if_fast);
              if (bVar2) {
                if (local_1050 ==
                    global_readers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
                  snestistics::StringBuilder::format
                            ((StringBuilder *)&profile._hide_if_fast,"%06X",(ulong)local_1050);
                }
                else {
                  snestistics::StringBuilder::format
                            ((StringBuilder *)&profile._hide_if_fast,"%06X-%06X",(ulong)local_1050,
                             (ulong)global_readers._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                    _4_4_);
                }
              }
              bVar3 = data_report::AccessIterator::has((AccessIterator *)&writers._current);
              if (bVar3) {
                snestistics::StringBuilder::column((StringBuilder *)&profile._hide_if_fast,0x14,4);
                data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
                AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::
                StringBuilder__(&writers._current,(StringBuilder *)&profile._hide_if_fast);
              }
              bVar3 = data_report::AccessIterator::has((AccessIterator *)local_12f0);
              if (bVar3) {
                snestistics::StringBuilder::column((StringBuilder *)&profile._hide_if_fast,0x3c,4);
                data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
                AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::
                StringBuilder__(local_12f0,(StringBuilder *)&profile._hide_if_fast);
              }
              if ((bVar2) && (stack0xffffffffffffeee0 != (Annotation *)0x0)) {
                snestistics::StringBuilder::column((StringBuilder *)&profile._hide_if_fast,0x5a,4);
                uVar11 = std::__cxx11::string::c_str();
                snestistics::StringBuilder::format
                          ((StringBuilder *)&profile._hide_if_fast,"%s [%06X-%06X]",uVar11,
                           (ulong)stack0xffffffffffffeee0->startOfRange,
                           (ulong)stack0xffffffffffffeee0->endOfRange);
              }
              ReportWriter::writeComment(writer,(StringBuilder *)&profile._hide_if_fast);
              bVar2 = false;
              data_report::AccessIterator::advance((AccessIterator *)&writers._current);
              data_report::AccessIterator::advance((AccessIterator *)local_12f0);
            }
            local_1050 = bank_less_adress;
          }
          else if (local_1050 == 0xffffffff) {
            local_1050 = bank_less_adress;
          }
          global_readers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = bank_less_adress;
          if (bVar1) {
            std::
            swap<snestistics::Annotation_const*,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                      ((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                        *)&global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                        *)&new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::
            swap<snestistics::Annotation_const*,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                      ((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                        *)&global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                        *)&new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::swap<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &new_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::swap<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &global_data,
                       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &rb_1.pc);
            stack0xffffffffffffeee0 = accessed_function;
          }
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &rb_1.pc);
          std::
          set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
          ::~set((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                  *)&new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &new_writers._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
          ::~set((set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                  *)&new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        else {
          for (rb.adress = ra.adress; uVar4 = (ulong)rb.adress,
              sVar5 = std::
                      vector<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                      ::size(&trace->memory_accesses), uVar4 < sVar5; rb.adress = rb.adress + 1) {
            pvVar6 = std::
                     vector<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                     ::operator[](&trace->memory_accesses,(ulong)rb.adress);
            new_readers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (*pvVar6).adress;
            if (bank_less_adress !=
                new_readers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) break;
            ra.adress = ra.adress + 1;
          }
        }
      }
      else {
        ra.adress = ra.adress + 1;
      }
      goto LAB_0017021b;
    }
    if (include_7e7f) goto LAB_00170312;
    ra.adress = ra.adress + 1;
  } while( true );
}

Assistant:

void data_report(ReportWriter &writer, const Trace &trace, const AnnotationResolver &annotations, const bool include_hwregs = true, const bool include_7e7f = true) {
	StringBuilder sb;

	Profile profile("Data report", true);
	writer.writeSeperator("Data analysis");

	sb.clear();
	sb.format("DATA RANGE");
	sb.column(20);
	sb.format("READERS");
	sb.column(60);
	sb.format("WRITERS");
	sb.column(90);
	sb.format("ANNOTATIONS");
	writer.writeSeperator(sb.c_str());

	Pointer first_global = INVALID_POINTER, last_global = INVALID_POINTER;

	std::set<const Annotation*> global_readers;
	std::set<uint32_t> global_unknown_readers;
	std::set<const Annotation*> global_writers;
	std::set<uint32_t> global_unknown_writers;
	const Annotation *global_data = nullptr;

	for (uint32_t p = 0; p < trace.memory_accesses.size(); ) {
		const Trace::MemoryAccess ra = trace.memory_accesses[p];
		Pointer adress = ra.adress;

		// This code ignores data reads from WRAM and/or hardware registers (if requested)
		{
			const uint8_t bank = adress>>16;
			const uint32_t bank_less_adress = adress&0xFFFF;
			if (bank == 0x7E || bank == 0x7F) {
				if (!include_7e7f) {
					p++;
					continue;
				}
			} else if (!include_hwregs && bank_less_adress >= 0x2000 && bank_less_adress <= 0x43FF) {
				p++;
				continue;
			}
		}

		const Annotation *data = nullptr;

		// Don't care about accesses to code
		// TODO: Check so we don't write code?
		{
			const Annotation *accessed_function = nullptr;
			annotations.resolve_annotation(adress, &accessed_function, &data);
			if (accessed_function != nullptr) {
				for (uint32_t j=p; j<trace.memory_accesses.size(); j++, p++) {
					const Trace::MemoryAccess rb = trace.memory_accesses[j];
					if (adress != rb.adress) break;
				}
				continue;
			}
		}

		bool need_flush = false;
		std::set<const Annotation*> new_readers;
		std::set<uint32_t> new_unknown_readers;
		std::set<const Annotation*> new_writers;
		std::set<uint32_t> new_unknown_writers;

		for (uint32_t j=p; j<trace.memory_accesses.size(); j++, p++) {
			const Trace::MemoryAccess rb = trace.memory_accesses[j];
			if (adress != rb.adress) break;

			const bool is_write = (rb.pc & 0x80000000)!=0;
			const Pointer pc = is_write ? rb.pc & ~0x80000000 : rb.pc;

			const Annotation *our_function = nullptr;
			annotations.resolve_annotation(pc, &our_function);

			if (our_function) {
				if (is_write) {
					new_writers.insert(our_function);
					if (!need_flush && global_writers.find(our_function) == global_writers.end()) need_flush = true;
				} else {
					new_readers.insert(our_function);
					if (!need_flush && global_readers.find(our_function) == global_readers.end()) need_flush = true;
				}
			} else {
				if (is_write) {
					new_unknown_writers.insert(pc);
					if (!need_flush && new_unknown_writers.find(pc) == new_unknown_writers.end()) need_flush = true;
				} else {
					new_unknown_readers.insert(pc);
					if (!need_flush && global_unknown_readers.find(pc) == global_unknown_readers.end()) need_flush = true;
				}
			}
		}

		if (data != global_data)
			need_flush = true;

		// We know that we aren't adding any new readers/writers, but did we produce the same full list?
		if (first_global != INVALID_POINTER) {
			if ((new_readers.size() != global_readers.size()) || (global_unknown_readers.size() != new_unknown_readers.size())) {
				need_flush = true;
			}
			if ((new_writers.size() != global_writers.size()) || (global_unknown_writers.size() != new_unknown_writers.size())) {
				need_flush = true;
			}
		}

		bool update_globals = false;
		if (need_flush || first_global == INVALID_POINTER) {
			update_globals = true;
		}

		struct AccessIterator {
			AccessIterator(const std::set<const Annotation*> &known, const std::set<uint32_t> &unknown) : _known(known), _unknown(unknown) {}
			const std::set<const Annotation*> &_known;
			const std::set<uint32_t> &_unknown;

			uint32_t _current = 0;
			bool has() {
				const uint32_t total = (uint32_t)_known.size() + (uint32_t)_unknown.size();
				return _current < total;
			}
			void advance() {
				_current++;
			}
			void emit(StringBuilder &sb) {
				if (_current < _known.size()) {
					auto it = _known.begin();
					for (uint32_t i=0; i<_current; i++, it++);
					const Annotation *a = *it;
					sb.format("%s", a->name.c_str());
				} else {
					uint32_t lc = _current - (uint32_t)_known.size();
					auto it = _unknown.begin();
					for (uint32_t i=0; i<lc; i++, it++);
					const uint32_t pc = *it;
					sb.format("%06X", pc);
				}
			}
		};

		AccessIterator readers(global_readers, global_unknown_readers);
		AccessIterator writers(global_writers, global_unknown_writers);

		// If last range was finished, print it
		if (need_flush) {
			bool first_line = true;
			while (readers.has() || writers.has()) {
				sb.clear();
				if (first_line) {
					if (first_global != last_global)
						sb.format("%06X-%06X", first_global, last_global);
					else
						sb.format("%06X", first_global);
				}
				if (readers.has()) {
					sb.column(20);
					readers.emit(sb);
				}
				if (writers.has()) {
					sb.column(60);
					writers.emit(sb);
				}
				if (first_line) {
					if (global_data) {
						sb.column(90);
						sb.format("%s [%06X-%06X]", global_data->name.c_str(), global_data->startOfRange, global_data->endOfRange);
					}
				}
				writer.writeComment(sb);
				first_line = false;
				readers.advance();
				writers.advance();
			}
			first_global = last_global = adress;
		} else {
			if (first_global == INVALID_POINTER) first_global = adress;
			last_global = adress;
		}
		
		if (update_globals) {
			std::swap(global_readers, new_readers);
			std::swap(global_writers, new_writers);
			std::swap(global_unknown_readers, new_unknown_readers);
			std::swap(global_unknown_writers, new_unknown_writers);
			global_data = data;
		}
	}

	// TODO: Print last range
}